

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte type1;
  ushort key;
  uint uVar1;
  byte type2_00;
  int iVar2;
  shared_container_t *psVar3;
  container_t *c;
  ushort *puVar4;
  uint8_t uVar5;
  bitset_container_t *src_2;
  long lVar6;
  shared_container_t *psVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint16_t uVar12;
  bitset_container_t *bc;
  shared_container_t *psVar13;
  uint uVar14;
  ulong uVar15;
  uint8_t type2;
  uint8_t result_type;
  byte local_56;
  uint8_t local_55;
  uint local_54;
  roaring_array_t *local_50;
  ulong local_48;
  ulong local_40;
  bitset_container_t *local_38;
  
  if (x1 == x2) {
    __assert_fail("x1 != x2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x43cb,
                  "void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *, const roaring_bitmap_t *)"
                 );
  }
  local_55 = '\0';
  local_54 = (x2->high_low_container).size;
  if (local_54 == 0) {
    return;
  }
  uVar14 = (x1->high_low_container).size;
  uVar9 = (ulong)uVar14;
  if (uVar14 == 0) {
    ra_overwrite(&x2->high_low_container,&x1->high_low_container,
                 (_Bool)((x2->high_low_container).flags & 1));
    return;
  }
  uVar12 = *(x1->high_low_container).keys;
  puVar4 = (x2->high_low_container).keys;
  uVar11 = 0;
  uVar15 = 0;
  local_50 = &x2->high_low_container;
LAB_00115d7d:
  do {
    uVar14 = (uint)uVar15;
    key = *puVar4;
    uVar11 = (ulong)(int)uVar11;
    uVar8 = (int)uVar9 - 1;
    while( true ) {
      uVar10 = (uint)uVar11;
      if (uVar12 == key) break;
      if (key <= uVar12) {
        local_56 = local_50->typecodes[uVar15 & 0xffff];
        c = get_copy_of_container
                      (local_50->containers[uVar15 & 0xffff],&local_56,(_Bool)(local_50->flags & 1))
        ;
        if ((local_50->flags & 1) != 0) {
          if (((roaring_array_t *)&local_50->size)->size <= (int)uVar14) goto LAB_00116079;
          local_50->containers[(int)uVar14] = c;
          local_50->typecodes[(int)uVar14] = local_56;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,uVar10,key,c,local_56);
        uVar8 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar8;
        uVar14 = uVar14 + 1;
        uVar15 = (ulong)uVar14;
        if (uVar14 != local_54) {
          uVar11 = uVar11 + 1;
          puVar4 = (ushort *)((ulong)((uVar14 & 0xffff) * 2) + (long)local_50->keys);
          goto LAB_00115d7d;
        }
        uVar10 = uVar10 + 1;
        uVar14 = local_54;
        goto LAB_00116032;
      }
      if (uVar8 == uVar10) goto LAB_00116037;
      uVar11 = uVar11 + 1;
      uVar12 = (x1->high_low_container).keys[uVar11 & 0xffff];
    }
    type1 = (x1->high_low_container).typecodes[uVar11 & 0xffff];
    psVar7 = (shared_container_t *)(x1->high_low_container).containers[uVar11 & 0xffff];
    local_56 = local_50->typecodes[uVar15 & 0xffff];
    src_2 = (bitset_container_t *)local_50->containers[uVar15 & 0xffff];
    if (type1 == 4) {
      local_48 = uVar9;
      psVar3 = (shared_container_t *)container_lazy_xor(psVar7,'\x04',src_2,local_56,&local_55);
      shared_container_free(psVar7);
LAB_00115f2a:
      psVar13 = psVar3;
      uVar5 = local_55;
      if (local_55 == '\x04') {
        uVar5 = psVar3->typecode;
        if (uVar5 == '\x04') {
LAB_00116098:
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        psVar13 = (shared_container_t *)psVar3->container;
      }
      psVar7 = psVar3;
      if ((uVar5 != '\x03') && (uVar5 != '\x02')) {
        uVar9 = local_48;
        if (uVar5 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x11c6,"_Bool container_nonzero_cardinality(const container_t *, uint8_t)")
          ;
        }
        goto LAB_00115f61;
      }
      uVar1 = (uint)local_48;
      if (*(int *)&psVar13->container < 1) goto LAB_00115fb0;
LAB_00115f90:
      uVar8 = uVar1;
      if ((x1->high_low_container).size <= (int)uVar10) {
LAB_00116079:
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a3a,
                      "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                     );
      }
      (x1->high_low_container).containers[uVar11] = psVar3;
      (x1->high_low_container).typecodes[uVar11] = local_55;
      uVar11 = (ulong)(uVar10 + 1);
    }
    else {
      type2_00 = local_56;
      if (local_56 == 4) {
        type2_00 = *(byte *)&src_2->words;
        if (type2_00 == 4) goto LAB_00116098;
        src_2 = *(bitset_container_t **)src_2;
      }
      if ((uint)type2_00 + (uint)type1 * 4 != 5) {
        local_48 = uVar9;
        if ((type1 == 1) && (*(int *)&psVar7->container == -1)) {
          local_40 = (ulong)type2_00;
          local_38 = src_2;
          iVar2 = bitset_container_compute_cardinality((bitset_container_t *)psVar7);
          type2_00 = (byte)local_40;
          *(int *)&psVar7->container = iVar2;
          src_2 = local_38;
        }
        psVar3 = (shared_container_t *)container_ixor(psVar7,type1,src_2,type2_00,&local_55);
        goto LAB_00115f2a;
      }
      bitset_container_xor_nocard((bitset_container_t *)psVar7,src_2,(bitset_container_t *)psVar7);
      local_55 = '\x01';
      psVar13 = psVar7;
LAB_00115f61:
      if (*(int *)&psVar13->container != 0) {
        psVar3 = psVar7;
        uVar1 = (uint)uVar9;
        if (*(int *)&psVar13->container != -1) goto LAB_00115f90;
        lVar6 = 0;
        do {
          if (*(long *)(*(long *)&psVar13->typecode + lVar6 * 8) != 0) goto LAB_00115f90;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x400);
      }
LAB_00115fb0:
      container_free(psVar7,local_55);
      ra_remove_at_index(&x1->high_low_container,uVar10);
    }
    uVar14 = uVar14 + 1;
    uVar15 = (ulong)uVar14;
    uVar10 = (uint)uVar11;
    if ((uVar10 == uVar8) || (uVar14 == local_54)) {
LAB_00116032:
      if (uVar10 != uVar8) {
        return;
      }
LAB_00116037:
      ra_append_copy_range
                (&x1->high_low_container,local_50,uVar14,local_54,(_Bool)(local_50->flags & 1));
      return;
    }
    uVar12 = (x1->high_low_container).keys[uVar10 & 0xffff];
    puVar4 = (ushort *)((ulong)((uVar14 & 0xffff) * 2) + (long)local_50->keys);
    uVar9 = (ulong)uVar8;
  } while( true );
}

Assistant:

void roaring_bitmap_lazy_xor_inplace(roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    assert(x1 != x2);
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.

            container_t *c;
            if (type1 == SHARED_CONTAINER_TYPE) {
                c = container_lazy_xor(c1, type1, c2, type2, &result_type);
                shared_container_free(CAST_shared(c1));  // release
            }
            else {
                c = container_lazy_ixor(c1, type1, c2, type2, &result_type);
            }

            if (container_nonzero_cardinality(c, result_type)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
                ++pos1;
            } else {
                container_free(c, result_type);
                ra_remove_at_index(&x1->high_low_container, pos1);
                --length1;
            }
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}